

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dconnected.cpp
# Opt level: O1

void __thiscall DReachabilityPropagator::clearPropState(DReachabilityPropagator *this)

{
  GraphPropagator::clearPropState(&this->super_GraphPropagator);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::clear
            (&(this->new_node)._M_t);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::clear
            (&(this->rem_node)._M_t);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::clear
            (&(this->new_edge)._M_t);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::clear
            (&(this->rem_edge)._M_t);
  return;
}

Assistant:

void DReachabilityPropagator::clearPropState() {
	GraphPropagator::clearPropState();
	new_node.clear();
	rem_node.clear();
	new_edge.clear();
	rem_edge.clear();
}